

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT3D.c
# Opt level: O1

uint32_t FACT3DApply(F3DAUDIO_DSP_SETTINGS *pDSPSettings,FACTCue *pCue)

{
  uint16_t uVar1;
  
  if (pCue != (FACTCue *)0x0 && pDSPSettings != (F3DAUDIO_DSP_SETTINGS *)0x0) {
    FACTCue_SetMatrixCoefficients
              (pCue,pDSPSettings->SrcChannelCount,pDSPSettings->DstChannelCount,
               pDSPSettings->pMatrixCoefficients);
    uVar1 = FACTCue_GetVariableIndex(pCue,"Distance");
    FACTCue_SetVariable(pCue,uVar1,pDSPSettings->EmitterToListenerDistance);
    uVar1 = FACTCue_GetVariableIndex(pCue,"DopplerPitchScalar");
    FACTCue_SetVariable(pCue,uVar1,pDSPSettings->DopplerFactor);
    uVar1 = FACTCue_GetVariableIndex(pCue,"OrientationAngle");
    FACTCue_SetVariable(pCue,uVar1,pDSPSettings->EmitterToListenerAngle * 57.295776);
  }
  return 0;
}

Assistant:

uint32_t FACT3DApply(
	F3DAUDIO_DSP_SETTINGS *pDSPSettings,
	FACTCue *pCue
) {
	if (pDSPSettings == NULL || pCue == NULL)
	{
		return 0;
	}

	FACTCue_SetMatrixCoefficients(
		pCue,
		pDSPSettings->SrcChannelCount,
		pDSPSettings->DstChannelCount,
		pDSPSettings->pMatrixCoefficients
	);
	FACTCue_SetVariable(
		pCue,
		FACTCue_GetVariableIndex(pCue, "Distance"),
		pDSPSettings->EmitterToListenerDistance
	);
	FACTCue_SetVariable(
		pCue,
		FACTCue_GetVariableIndex(pCue, "DopplerPitchScalar"),
		pDSPSettings->DopplerFactor
	);
	FACTCue_SetVariable(
		pCue,
		FACTCue_GetVariableIndex(pCue, "OrientationAngle"),
		pDSPSettings->EmitterToListenerAngle * (180.0f / F3DAUDIO_PI)
	);
	return 0;
}